

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppix_manager.c
# Opt level: O2

int write_ppixfaix(int coff,int compno,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,
                  opj_cio_t *cio)

{
  int pos;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  unsigned_long_long v;
  long lVar24;
  int iVar25;
  ulong uVar26;
  int local_184;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_128;
  long local_120;
  long local_f8;
  
  pos = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x66616978,4);
  cio_write(cio,0,1);
  lVar8 = (long)compno;
  lVar14 = (long)cstr_info.numlayers;
  local_184 = 0;
  for (lVar23 = 0; lVar23 <= cstr_info.numdecompos[lVar8]; lVar23 = lVar23 + 1) {
    local_184 = local_184 +
                (cstr_info.tile)->pw[lVar23] * (cstr_info.tile)->ph[lVar23] * cstr_info.numlayers;
  }
  cio_write(cio,(long)local_184,4);
  v = (long)cstr_info.th * (long)cstr_info.tw;
  cio_write(cio,v,4);
  lVar23 = (long)cstr_info.numcomps;
  uVar2 = 0;
  if (0 < cstr_info.numlayers) {
    uVar2 = (ulong)(uint)cstr_info.numlayers;
  }
  uVar3 = 0;
  if (0 < (int)v) {
    uVar3 = v & 0xffffffff;
  }
  lVar4 = lVar14 * 0x20;
  lVar5 = lVar23 * lVar14 * 0x20;
  lVar9 = lVar23 * 0x20;
  local_120 = -1;
  local_f8 = -1;
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    iVar1 = cstr_info.numdecompos[lVar8];
    lVar10 = (long)(iVar1 + 1);
    local_138 = lVar14 * lVar8 * 0x20 * lVar10 + 0x10;
    local_140 = 0;
    iVar25 = 0;
    local_150 = lVar8 << 5;
    local_148 = lVar8 << 5;
    for (lVar13 = 0; lVar13 <= iVar1; lVar13 = lVar13 + 1) {
      uVar15 = (long)cstr_info.tile[uVar7].ph[lVar13] * (long)cstr_info.tile[uVar7].pw[lVar13];
      uVar20 = 0;
      if (0 < (int)uVar15) {
        uVar20 = uVar15 & 0xffffffff;
      }
      lVar24 = (local_140 * uVar15 + lVar8) * lVar4 + 0x10;
      lVar18 = ((compno * (int)uVar15) * lVar10 + lVar13) * lVar4 + 0x10;
      lVar6 = local_150 * uVar15 + 0x10;
      lVar11 = local_148 * uVar15 + 0x10;
      local_128 = local_138;
      for (uVar17 = 0; lVar12 = lVar11, lVar16 = lVar6, lVar19 = lVar18, lVar21 = local_128,
          lVar22 = lVar24, uVar26 = uVar2, uVar17 != uVar20; uVar17 = uVar17 + 1) {
        while (uVar26 != 0) {
          switch(cstr_info.prog) {
          case LRCP:
            local_f8 = *(long *)((long)cstr_info.tile[uVar7].packet + lVar16 + -0x10);
            local_120 = *(long *)((long)&(cstr_info.tile[uVar7].packet)->start_pos + lVar16);
            break;
          case RLCP:
            local_f8 = *(long *)((long)cstr_info.tile[uVar7].packet + lVar12 + -0x10);
            local_120 = *(long *)((long)&(cstr_info.tile[uVar7].packet)->start_pos + lVar12);
            break;
          case RPCL:
            local_f8 = *(long *)((long)cstr_info.tile[uVar7].packet + lVar22 + -0x10);
            local_120 = *(long *)((long)&(cstr_info.tile[uVar7].packet)->start_pos + lVar22);
            break;
          case PCRL:
            local_f8 = *(long *)((long)cstr_info.tile[uVar7].packet + lVar21 + -0x10);
            local_120 = *(long *)((long)&(cstr_info.tile[uVar7].packet)->start_pos + lVar21);
            break;
          case CPRL:
            local_f8 = *(long *)((long)cstr_info.tile[uVar7].packet + lVar19 + -0x10);
            local_120 = *(long *)((long)&(cstr_info.tile[uVar7].packet)->start_pos + lVar19);
            break;
          default:
            fwrite("failed to ppix indexing\n",0x18,1,_stderr);
          }
          cio_write(cio,local_f8 - coff,4);
          cio_write(cio,(local_120 - local_f8) + 1,4);
          lVar12 = lVar12 + uVar15 * lVar9;
          lVar16 = lVar16 + lVar9 * lVar10 * uVar15;
          lVar19 = lVar19 + 0x20;
          lVar21 = lVar21 + 0x20;
          lVar22 = lVar22 + 0x20;
          uVar26 = uVar26 - 1;
        }
        lVar24 = lVar24 + lVar5;
        local_128 = local_128 + lVar5 * lVar10;
        lVar18 = lVar18 + lVar4 * lVar10;
        lVar6 = lVar6 + 0x20;
        lVar11 = lVar11 + 0x20;
      }
      iVar25 = iVar25 + (int)uVar2 * (int)uVar20;
      local_140 = local_140 + lVar23;
      local_138 = local_138 + lVar4;
      local_150 = local_150 + lVar9;
      local_148 = local_148 + lVar5;
    }
    for (; iVar25 < local_184; iVar25 = iVar25 + 1) {
      cio_write(cio,0,4);
      cio_write(cio,0,4);
    }
  }
  iVar1 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(iVar1 - pos),4);
  cio_seek(cio,iVar1);
  return iVar1 - pos;
}

Assistant:

int write_ppixfaix( int coff, int compno, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp, tileno, version, i, nmax, size_of_coding; /* 4 or 8*/
  opj_tile_info_t *tile_Idx;
  opj_packet_info_t packet;
  int resno, precno, layno, num_packet;
  int numOfres, numOfprec, numOflayers;
  packet.end_pos = packet.end_ph_pos = packet.start_pos = -1;
  (void)EPHused; /* unused ? */

  if( j2klen > pow( 2, 32)){
    size_of_coding =  8;
    version = 1;
  }
  else{
    size_of_coding = 4;
    version = 0;
  }
  
  lenp = cio_tell( cio);
  cio_skip( cio, 4);              /* L [at the end]      */
  cio_write( cio, JPIP_FAIX, 4);  /* FAIX                */ 
  cio_write( cio, version, 1);     /* Version 0 = 4 bytes */

  nmax = 0;
  for( i=0; i<=cstr_info.numdecompos[compno]; i++)
    nmax += cstr_info.tile[0].ph[i] * cstr_info.tile[0].pw[i] * cstr_info.numlayers;
  
  cio_write( cio, nmax, size_of_coding); /* NMAX */
  cio_write( cio, cstr_info.tw*cstr_info.th, size_of_coding);      /* M    */

  for( tileno=0; tileno<cstr_info.tw*cstr_info.th; tileno++){
    tile_Idx = &cstr_info.tile[ tileno];
 
    num_packet=0;
    numOfres = cstr_info.numdecompos[compno] + 1;
  
    for( resno=0; resno<numOfres ; resno++){
      numOfprec = tile_Idx->pw[resno]*tile_Idx->ph[resno];
      for( precno=0; precno<numOfprec; precno++){
	numOflayers = cstr_info.numlayers;
	for( layno=0; layno<numOflayers; layno++){

	  switch ( cstr_info.prog){
	  case LRCP:
	    packet = tile_Idx->packet[ ((layno*numOfres+resno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RLCP:
	    packet = tile_Idx->packet[ ((resno*numOflayers+layno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RPCL:
	    packet = tile_Idx->packet[ ((resno*numOfprec+precno)*cstr_info.numcomps+compno)*numOflayers+layno];
	    break;
	  case PCRL:
	    packet = tile_Idx->packet[ ((precno*cstr_info.numcomps+compno)*numOfres+resno)*numOflayers + layno];
	    break;
	  case CPRL:
	    packet = tile_Idx->packet[ ((compno*numOfprec+precno)*numOfres+resno)*numOflayers + layno];
	    break;
	  default:
	    fprintf( stderr, "failed to ppix indexing\n");
	  }

	  cio_write( cio, packet.start_pos-coff, size_of_coding);             /* start position */
	  cio_write( cio, packet.end_pos-packet.start_pos+1, size_of_coding); /* length         */
	  
	  num_packet++;
	}
      }
    }
  
    while( num_packet < nmax){     /* PADDING */
      cio_write( cio, 0, size_of_coding); /* start position            */
      cio_write( cio, 0, size_of_coding); /* length                    */
      num_packet++;
    }   
  }

  len = cio_tell( cio)-lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);        /* L  */
  cio_seek( cio, lenp+len);

  return len;
}